

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O0

schar lev_by_name(char *nam)

{
  boolean bVar1;
  xchar xVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  char local_138 [8];
  char buf [256];
  int idxtoo;
  int idx;
  char *p;
  s_level *psStack_20;
  d_level dlev;
  s_level *slev;
  char *pcStack_10;
  schar lev;
  char *nam_local;
  
  slev._7_1_ = '\0';
  iVar3 = strncasecmp(nam,"the ",4);
  pcStack_10 = nam;
  if (iVar3 == 0) {
    pcStack_10 = nam + 4;
  }
  pcVar5 = strstri(pcStack_10," level");
  if ((pcVar5 != (char *)0x0) && (pcVar6 = eos(pcStack_10), pcVar5 == pcVar6 + -6)) {
    pcStack_10 = strcpy(local_138,pcStack_10);
    pcVar5 = eos(local_138);
    pcVar5[-6] = '\0';
  }
  iVar3 = strncasecmp(pcStack_10,"gehennom",0xffffffffffffffff);
  if ((iVar3 == 0) || (iVar3 = strncasecmp(pcStack_10,"hell",0xffffffffffffffff), iVar3 == 0)) {
    bVar1 = In_V_tower(&u.uz);
    if (bVar1 == '\0') {
      pcStack_10 = "valley";
    }
    else {
      pcStack_10 = " to Vlad\'s tower";
    }
  }
  psStack_20 = find_level(pcStack_10);
  if (psStack_20 == (s_level *)0x0) {
    buf._252_4_ = find_branch(pcStack_10,(proto_dungeon *)0x0);
    if (((int)buf._252_4_ < 0) && (pcVar5 = strstri(pcStack_10," to "), pcVar5 != (char *)0x0)) {
      buf._252_4_ = find_branch(pcVar5 + 4,(proto_dungeon *)0x0);
    }
    if (-1 < (int)buf._252_4_) {
      buf._248_4_ = (int)buf._252_4_ >> 8 & 0xff;
      uVar4 = buf._252_4_ & 0xff;
      if ((flags.debug != '\0') ||
         ((((levels[(int)uVar4] != (level *)0x0 &&
            ((*(uint *)&(levels[(int)uVar4]->flags).field_0x8 >> 0x16 & 1) == 0)) &&
           (levels[(int)buf._248_4_] != (level *)0x0)) &&
          ((*(uint *)&(levels[(int)buf._248_4_]->flags).field_0x8 >> 0x16 & 1) == 0)))) {
        xVar2 = SUB41(buf._252_4_,1);
        buf._252_4_ = uVar4;
        xVar2 = ledger_to_dnum(xVar2);
        if (xVar2 == u.uz.dnum) {
          buf[0xfc] = buf[0xf8];
          buf[0xfd] = buf[0xf9];
          buf[0xfe] = buf[0xfa];
          buf[0xff] = buf[0xfb];
        }
        xVar2 = ledger_to_dnum((xchar)buf._252_4_);
        p._6_2_ = (d_level)CONCAT11(p._7_1_,xVar2);
        xVar2 = ledger_to_dlev((xchar)buf._252_4_);
        p._6_2_ = (d_level)CONCAT11(xVar2,p._6_1_);
        slev._7_1_ = depth((d_level *)((long)&p + 6));
      }
    }
  }
  else {
    p._6_2_ = psStack_20->dlevel;
    xVar2 = ledger_no((d_level *)((long)&p + 6));
    buf._252_4_ = SEXT14(xVar2);
    if ((((p._6_1_ == u.uz.dnum) ||
         ((u.uz.dnum == dungeon_topology.d_valley_level.dnum &&
          (p._6_1_ == dungeon_topology.d_medusa_level.dnum)))) ||
        ((u.uz.dnum == dungeon_topology.d_medusa_level.dnum &&
         (p._6_1_ == dungeon_topology.d_valley_level.dnum)))) &&
       ((flags.debug != '\0' ||
        ((levels[(int)buf._252_4_] != (level *)0x0 &&
         ((*(uint *)&(levels[(int)buf._252_4_]->flags).field_0x8 >> 0x16 & 1) == 0)))))) {
      slev._7_1_ = depth(&psStack_20->dlevel);
    }
  }
  return slev._7_1_;
}

Assistant:

schar lev_by_name(const char *nam)
{
    schar lev = 0;
    s_level *slev;
    d_level dlev;
    const char *p;
    int idx, idxtoo;
    char buf[BUFSZ];

    /* allow strings like "the oracle level" to find "oracle" */
    if (!strncmpi(nam, "the ", 4)) nam += 4;
    if ((p = strstri(nam, " level")) != 0 && p == eos((char*)nam) - 6) {
	nam = strcpy(buf, nam);
	*(eos(buf) - 6) = '\0';
    }
    /* hell is the old name, and wouldn't match; gehennom would match its
       branch, yielding the castle level instead of the valley of the dead */
    if (!strcmpi(nam, "gehennom") || !strcmpi(nam, "hell")) {
	if (In_V_tower(&u.uz)) nam = " to Vlad's tower";  /* branch to... */
	else nam = "valley";
    }

    if ((slev = find_level(nam)) != 0) {
	dlev = slev->dlevel;
	idx = ledger_no(&dlev);
	if ((dlev.dnum == u.uz.dnum ||
		/* within same branch, or else main dungeon <-> gehennom */
		(u.uz.dnum == valley_level.dnum &&
			dlev.dnum == medusa_level.dnum) ||
		(u.uz.dnum == medusa_level.dnum &&
			dlev.dnum == valley_level.dnum)) &&
	    (/* either wizard mode or else seen and not forgotten */
	     wizard || (levels[idx] && !levels[idx]->flags.forgotten))) {
	    lev = depth(&slev->dlevel);
	}
    } else {	/* not a specific level; try branch names */
	idx = find_branch(nam, NULL);
	/* "<branch> to Xyzzy" */
	if (idx < 0 && (p = strstri(nam, " to ")) != 0)
	    idx = find_branch(p + 4, NULL);

	if (idx >= 0) {
	    idxtoo = (idx >> 8) & 0x00FF;
	    idx &= 0x00FF;
	    if (  /* either wizard mode, or else _both_ sides of branch seen */
		wizard ||
		((levels[idx] && !levels[idx]->flags.forgotten) &&
		 (levels[idxtoo] && !levels[idxtoo]->flags.forgotten))) {
		if (ledger_to_dnum(idxtoo) == u.uz.dnum) idx = idxtoo;
		dlev.dnum = ledger_to_dnum(idx);
		dlev.dlevel = ledger_to_dlev(idx);
		lev = depth(&dlev);
	    }
	}
    }
    return lev;
}